

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O2

NodeAVL * avlRemove0(NodeAVL *nd,int freeMem)

{
  NodeAVL *pNVar1;
  NodeAVL *pNVar2;
  NodeAVL *pNVar3;
  NodeAVL *pNVar4;
  NodeAVL *l;
  
  pNVar3 = nd->left;
  pNVar4 = nd->tmp;
  if (pNVar4 == (NodeAVL *)0x0) {
    pNVar4 = nd->right;
    pNVar1 = nd->parent;
    if (freeMem != 0) {
      free(nd);
    }
    pNVar2 = pNVar4;
    if (pNVar4 == (NodeAVL *)0x0) {
      if (pNVar3 == (NodeAVL *)0x0) {
        pNVar3 = (NodeAVL *)0x0;
      }
      else {
        pNVar3->parent = pNVar1;
      }
      return pNVar3;
    }
    do {
      nd = pNVar2;
      pNVar2 = nd->left;
    } while (nd->left != (NodeAVL *)0x0);
    if (nd->right != (NodeAVL *)0x0) {
      nd->right->parent = nd->parent;
    }
    pNVar4 = avlRemoveMin(pNVar4);
    nd->right = pNVar4;
    nd->left = pNVar3;
    nd->parent = pNVar1;
    if (pNVar3 != (NodeAVL *)0x0) {
      pNVar3->parent = nd;
    }
    if (pNVar4 != (NodeAVL *)0x0) {
      pNVar4->parent = nd;
    }
  }
  else {
    if (pNVar4 == pNVar3) {
      pNVar3 = avlRemove0(pNVar3,freeMem);
      nd->left = pNVar3;
      pNVar4 = nd->tmp;
    }
    if (pNVar4 == nd->right) {
      pNVar3 = avlRemove0(nd->right,freeMem);
      nd->right = pNVar3;
    }
    nd->tmp = (NodeAVL *)0x0;
  }
  pNVar3 = avlBalance(nd);
  return pNVar3;
}

Assistant:

static
NodeAVL* avlRemove0( NodeAVL* nd, const int freeMem ){
    if ( nd->tmp ){
        if ( nd->tmp == nd->left ) nd->left = avlRemove0( nd->left, freeMem );
        if ( nd->tmp == nd->right ) nd->right = avlRemove0( nd->right, freeMem );
        nd->tmp = 0;
        return avlBalance( nd ); // FIXME ma tu byt ten return?
    } else return avlRemoveThisNode( nd, freeMem );
}